

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerMSL::is_sample_rate(CompilerMSL *this)

{
  ExecutionModel EVar1;
  Capability *pCVar2;
  Capability *pCVar3;
  byte local_41;
  byte local_29;
  byte local_1d;
  Capability local_1c;
  SmallVector<spv::Capability,_8UL> *local_18;
  SmallVector<spv::Capability,_8UL> *caps;
  CompilerMSL *this_local;
  
  caps = (SmallVector<spv::Capability,_8UL> *)this;
  local_18 = Compiler::get_declared_capabilities((Compiler *)this);
  EVar1 = Compiler::get_execution_model((Compiler *)this);
  local_1d = 0;
  if (EVar1 == ExecutionModelFragment) {
    local_29 = 1;
    if (((this->msl_options).force_sample_rate_shading & 1U) == 0) {
      pCVar2 = VectorView<spv::Capability>::begin(&local_18->super_VectorView<spv::Capability>);
      pCVar3 = VectorView<spv::Capability>::end(&local_18->super_VectorView<spv::Capability>);
      local_1c = CapabilitySampleRateShading;
      pCVar2 = ::std::find<spv::Capability_const*,spv::Capability>(pCVar2,pCVar3,&local_1c);
      pCVar3 = VectorView<spv::Capability>::end(&local_18->super_VectorView<spv::Capability>);
      local_29 = 1;
      if (pCVar2 == pCVar3) {
        local_41 = 0;
        if (((this->msl_options).use_framebuffer_fetch_subpasses & 1U) != 0) {
          local_41 = (this->super_CompilerGLSL).super_Compiler.need_subpass_input_ms;
        }
        local_29 = local_41;
      }
    }
    local_1d = local_29;
  }
  return (bool)(local_1d & 1);
}

Assistant:

bool CompilerMSL::is_sample_rate() const
{
	auto &caps = get_declared_capabilities();
	return get_execution_model() == ExecutionModelFragment &&
	       (msl_options.force_sample_rate_shading ||
	        std::find(caps.begin(), caps.end(), CapabilitySampleRateShading) != caps.end() ||
	        (msl_options.use_framebuffer_fetch_subpasses && need_subpass_input_ms));
}